

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  char *in_R8;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  undefined1 local_a;
  spirv_cross local_9;
  
  sVar2 = expr->_M_string_length;
  if (sVar2 != 0) {
    bVar1 = *(expr->_M_dataplus)._M_p;
    if ((((ulong)bVar1 < 0x2e) && ((0x2c4200000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (bVar1 == 0x7e)) {
      bVar4 = true;
      goto LAB_001bc304;
    }
  }
  bVar4 = false;
LAB_001bc304:
  if (!bVar4) {
    if (sVar2 == 0) {
      bVar7 = true;
    }
    else {
      iVar6 = 0;
      pcVar5 = (char *)0x0;
      do {
        bVar1 = pcVar5[(long)(expr->_M_dataplus)._M_p];
        if (bVar1 < 0x5b) {
          if (bVar1 == 0x28) {
LAB_001bc34a:
            iVar6 = iVar6 + 1;
            goto LAB_001bc37b;
          }
          if (bVar1 == 0x29) goto LAB_001bc34f;
LAB_001bc35d:
          if (bVar1 != 0x20 || iVar6 != 0) goto LAB_001bc37b;
          bVar7 = true;
          iVar6 = 0;
          bVar4 = true;
        }
        else {
          if (bVar1 != 0x5d) {
            if (bVar1 != 0x5b) goto LAB_001bc35d;
            goto LAB_001bc34a;
          }
LAB_001bc34f:
          if (iVar6 == 0) {
            __assert_fail("paren_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0xf29,
                          "string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
          }
          iVar6 = iVar6 + -1;
LAB_001bc37b:
          bVar7 = false;
        }
        in_R8 = pcVar5;
      } while ((!bVar7) &&
              (in_R8 = pcVar5 + 1, bVar7 = (char *)(sVar2 - 1) != pcVar5, pcVar5 = in_R8, bVar7));
      bVar7 = iVar6 == 0;
    }
    if (!bVar7) {
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0xf32,"string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
    }
  }
  if (bVar4) {
    local_9 = (spirv_cross)0x28;
    local_a = 0x29;
    join<char,std::__cxx11::string_const&,char>
              (__return_storage_ptr__,&local_9,(char *)expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a,in_R8);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (expr->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (need_parens)
		return join('(', expr, ')');
	else
		return expr;
}